

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifold_test.cpp
# Opt level: O0

Polygons * RotatePolygons(Polygons *__return_storage_ptr__,Polygons *polys,int index)

{
  bool bVar1;
  iterator __last;
  __normal_iterator<linalg::vec<double,_2>_*,_std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>
  local_80;
  __normal_iterator<linalg::vec<double,_2>_*,_std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>
  local_78;
  __normal_iterator<linalg::vec<double,_2>_*,_std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>
  local_70;
  undefined1 local_58 [8];
  vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_> rotatedPolygon;
  vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_> *polygon;
  iterator __end1;
  iterator __begin1;
  Polygons *__range1;
  int index_local;
  Polygons *polys_local;
  Polygons *rotatedPolys;
  
  std::
  vector<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
  ::vector(__return_storage_ptr__);
  __end1 = std::
           vector<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
           ::begin(polys);
  polygon = (vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_> *)
            std::
            vector<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
            ::end(polys);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_*,_std::vector<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>_>
                                     *)&polygon), bVar1) {
    rotatedPolygon.
    super__Vector_base<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)__gnu_cxx::
                  __normal_iterator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_*,_std::vector<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>_>
                  ::operator*(&__end1);
    std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>::vector
              ((vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_> *)local_58,
               (vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_> *)
               rotatedPolygon.
               super__Vector_base<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage);
    local_70._M_current =
         (vec<double,_2> *)
         std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>::begin
                   ((vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_> *)
                    local_58);
    local_80._M_current =
         (vec<double,_2> *)
         std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>::begin
                   ((vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_> *)
                    local_58);
    local_78 = __gnu_cxx::
               __normal_iterator<linalg::vec<double,_2>_*,_std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>
               ::operator+(&local_80,(long)index);
    __last = std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>::end
                       ((vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_> *)
                        local_58);
    std::_V2::
    rotate<__gnu_cxx::__normal_iterator<linalg::vec<double,2>*,std::vector<linalg::vec<double,2>,std::allocator<linalg::vec<double,2>>>>>
              (local_70,local_78,
               (__normal_iterator<linalg::vec<double,_2>_*,_std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>
                )__last._M_current);
    std::
    vector<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)local_58);
    std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>::~vector
              ((vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_> *)local_58)
    ;
    __gnu_cxx::
    __normal_iterator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_*,_std::vector<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>,_std::allocator<std::vector<linalg::vec<double,_2>,_std::allocator<linalg::vec<double,_2>_>_>_>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

Polygons RotatePolygons(Polygons polys, const int index) {
  Polygons rotatedPolys;
  for (auto& polygon : polys) {
    auto rotatedPolygon = polygon;
    std::rotate(rotatedPolygon.begin(), rotatedPolygon.begin() + index,
                rotatedPolygon.end());
    rotatedPolys.push_back(rotatedPolygon);
  }
  return rotatedPolys;
}